

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_garbage_perm.c
# Opt level: O0

void __thiscall lu_garbage_perm(lu *this)

{
  int iVar1;
  int iVar2;
  void *__dest;
  void *__dest_00;
  long lVar3;
  int iVar4;
  long in_RDI;
  lu_int marker;
  lu_int put;
  lu_int get;
  lu_int j;
  lu_int *marked;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int pivotlen;
  lu_int m;
  undefined4 local_34;
  undefined4 local_30;
  
  iVar1 = *(int *)(in_RDI + 0x54);
  local_34 = *(int *)(in_RDI + 400);
  __dest = *(void **)(in_RDI + 0x1d8);
  __dest_00 = *(void **)(in_RDI + 0x1e8);
  lVar3 = *(long *)(in_RDI + 0x290);
  if (iVar1 < local_34) {
    iVar4 = *(int *)(in_RDI + 0x18c) + 1;
    *(int *)(in_RDI + 0x18c) = iVar4;
    local_30 = local_34;
    while (local_30 = local_30 + -1, -1 < local_30) {
      iVar2 = *(int *)((long)__dest + (long)local_30 * 4);
      if (*(int *)(lVar3 + (long)iVar2 * 4) != iVar4) {
        *(int *)(lVar3 + (long)iVar2 * 4) = iVar4;
        local_34 = local_34 + -1;
        *(int *)((long)__dest + (long)local_34 * 4) = iVar2;
        *(undefined4 *)((long)__dest_00 + (long)local_34 * 4) =
             *(undefined4 *)((long)__dest_00 + (long)local_30 * 4);
      }
    }
    memmove(__dest,(void *)((long)__dest + (long)local_34 * 4),(long)iVar1 << 2);
    memmove(__dest_00,(void *)((long)__dest_00 + (long)local_34 * 4),(long)iVar1 << 2);
    *(int *)(in_RDI + 400) = iVar1;
  }
  return;
}

Assistant:

void lu_garbage_perm(struct lu *this)
{
    const lu_int m      = this->m;
    lu_int pivotlen     = this->pivotlen;
    lu_int *pivotcol    = this->pivotcol;
    lu_int *pivotrow    = this->pivotrow;
    lu_int *marked      = this->marked;

    lu_int j, get, put, marker;

    if (pivotlen > m)
    {
        marker = ++this->marker;
        put = pivotlen;
        for (get = pivotlen-1; get >= 0; get--)
        {
            if (marked[j = pivotcol[get]] != marker)
            {
                marked[j] = marker;
                pivotcol[--put] = j;
                pivotrow[put] = pivotrow[get];
            }
        }
        assert(put+m == pivotlen);
        memmove(pivotcol, pivotcol+put, m*sizeof(lu_int));
        memmove(pivotrow, pivotrow+put, m*sizeof(lu_int));
        this->pivotlen = m;
    }
}